

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

QAction * __thiscall QMenuPrivate::actionAt(QMenuPrivate *this,QPoint p)

{
  ulong uVar1;
  char cVar2;
  int i;
  ulong uVar3;
  long lVar4;
  QAction *pQVar5;
  long in_FS_OFFSET;
  QRect local_48;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = p;
  local_48 = rect(this);
  pQVar5 = (QAction *)0x0;
  cVar2 = QRect::contains((QPoint *)&local_48,SUB81(&local_38,0));
  if (cVar2 != '\0') {
    pQVar5 = (QAction *)0x0;
    lVar4 = 0;
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if ((ulong)(this->actionRects).d.size <= uVar3) goto LAB_004212da;
      cVar2 = QRect::contains((QPoint *)((long)&(((this->actionRects).d.ptr)->x1).m_i + lVar4),
                              SUB81(&local_38,0));
      lVar4 = lVar4 + 0x10;
      uVar1 = uVar3 + 1;
    } while (cVar2 == '\0');
    pQVar5 = (this->super_QWidgetPrivate).actions.d.ptr[uVar3];
  }
LAB_004212da:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenuPrivate::actionAt(QPoint p) const
{
    if (!rect().contains(p))     //sanity check
       return nullptr;

    for(int i = 0; i < actionRects.size(); i++) {
        if (actionRects.at(i).contains(p))
            return actions.at(i);
    }
    return nullptr;
}